

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Liby::Socket::setNonagle(Socket *this,bool flag)

{
  int iVar1;
  uint local_18;
  undefined1 local_11;
  int nodelay;
  bool flag_local;
  Socket *this_local;
  
  local_11 = flag;
  _nodelay = this;
  if (((this->isUdp_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!isUdp_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,100,"void Liby::Socket::setNonagle(bool)");
  }
  local_18 = (uint)flag;
  iVar1 = setsockopt(this->fd_,6,1,&local_18,4);
  if (iVar1 < 0) {
    throw_err();
  }
  return;
}

Assistant:

void Socket::setNonagle(bool flag) {
    assert(!isUdp_);
    int nodelay = flag ? 1 : 0;
    if (::setsockopt(fd_, IPPROTO_TCP, TCP_NODELAY, &nodelay, sizeof(int)) <
        0) {
        throw_err();
    }
}